

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::Limiter::Release(Limiter *this)

{
  long lVar1;
  int *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  *in_RDI = *in_RDI + 1;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Release() { acquires_allowed_.fetch_add(1, std::memory_order_relaxed); }